

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5IndexReinit(Fts5Index *p)

{
  int iVar1;
  Fts5Structure s;
  Fts5Structure local_38;
  
  if (p->pStruct != (Fts5Structure *)0x0) {
    fts5StructureRelease(p->pStruct);
    p->pStruct = (Fts5Structure *)0x0;
  }
  local_38.nSegment = 0;
  local_38.nLevel = 0;
  local_38.aLevel[0].nMerge = 0;
  local_38.aLevel[0].nSeg = 0;
  local_38.nRef = 0;
  local_38._4_4_ = 0;
  local_38.nWriteCounter = 0;
  local_38.aLevel[0].aSeg = (Fts5StructureSegment *)0x0;
  fts5DataWrite(p,1,"",0);
  fts5StructureWrite(p,&local_38);
  iVar1 = p->rc;
  p->rc = 0;
  return iVar1;
}

Assistant:

static int sqlite3Fts5IndexReinit(Fts5Index *p){
  Fts5Structure s;
  fts5StructureInvalidate(p);
  memset(&s, 0, sizeof(Fts5Structure));
  fts5DataWrite(p, FTS5_AVERAGES_ROWID, (const u8*)"", 0);
  fts5StructureWrite(p, &s);
  return fts5IndexReturn(p);
}